

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O2

Error __thiscall asmjit::v1_14::BaseRAPass::initGlobalLiveSpans(BaseRAPass *this)

{
  byte bVar1;
  undefined8 in_RAX;
  byte *pbVar2;
  RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>_> *pRVar3;
  long lVar4;
  RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>_> **ppRVar5;
  Iterator __begin2;
  RegGroup group_00;
  RegGroup group;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  for (group_00 = k0; group_00 != kPC; group_00 = group_00 + kVec) {
    uStack_38 = CONCAT17(group_00,(undefined7)uStack_38);
    pbVar2 = RARegCount::operator[](&this->_physRegCount,group_00);
    bVar1 = *pbVar2;
    if (bVar1 == 0) {
      pRVar3 = (RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>_> *)0x0;
    }
    else {
      pRVar3 = (RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>_> *)
               ZoneAllocator::alloc(&this->_allocator,(ulong)bVar1 << 4);
      if (pRVar3 == (RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>_> *)0x0)
      break;
      for (lVar4 = 0; (ulong)bVar1 * 0x10 != lVar4; lVar4 = lVar4 + 0x10) {
        *(undefined8 *)(pRVar3 + lVar4) = 0;
        *(undefined8 *)(pRVar3 + lVar4 + 8) = 0;
      }
    }
    ppRVar5 = Support::
              Array<asmjit::v1_14::RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>_>_*,_4UL>
              ::operator[]<asmjit::v1_14::RegGroup>
                        (&this->_globalLiveSpans,(RegGroup *)((long)&uStack_38 + 7));
    *ppRVar5 = pRVar3;
  }
  return (Error)(group_00 != kPC);
}

Assistant:

ASMJIT_FAVOR_SPEED Error BaseRAPass::initGlobalLiveSpans() noexcept {
  for (RegGroup group : RegGroupVirtValues{}) {
    size_t physCount = _physRegCount[group];
    LiveRegSpans* liveSpans = nullptr;

    if (physCount) {
      liveSpans = allocator()->allocT<LiveRegSpans>(physCount * sizeof(LiveRegSpans));
      if (ASMJIT_UNLIKELY(!liveSpans))
        return DebugUtils::errored(kErrorOutOfMemory);

      for (size_t physId = 0; physId < physCount; physId++)
        new(Support::PlacementNew{&liveSpans[physId]}) LiveRegSpans();
    }

    _globalLiveSpans[group] = liveSpans;
  }

  return kErrorOk;
}